

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t result;
  sysbvm_tuple_t type;
  anon_struct_24_3_973aa3f0 gcFrame;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.tuple = 0;
  gcFrame.slot = 0;
  gcFrame.result = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 3;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  gcFrame.tuple =
       sysbvm_functionBytecodeDirectCompiler_compileASTNode
                 (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                  *(sysbvm_tuple_t *)(*arguments + 0x28));
  gcFrame.slot = sysbvm_functionBytecodeAssembler_addLiteral
                           (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                            *(sysbvm_tuple_t *)(*arguments + 0x38));
  result = sysbvm_functionBytecodeAssembler_newTemporary
                     (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                      *(sysbvm_tuple_t *)(*arguments + 0x20));
  uVar1 = *(ulong *)(*arguments + 0x28);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    type = *(sysbvm_tuple_t *)(uVar1 + 0x20);
  }
  else {
    type = 0;
  }
  gcFrame.result = result;
  _Var2 = sysbvm_type_isPointerLikeType(type);
  if (_Var2) {
    sysbvm_functionBytecodeAssembler_refSlotAt
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),result,
               gcFrame.tuple,gcFrame.slot);
  }
  else {
    sysbvm_functionBytecodeAssembler_slotAt
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),result,
               gcFrame.tuple,gcFrame.slot);
  }
  sysbvm_stackFrame_popRecord(&local_48);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astTupleSlotNamedAtNode_t **slotNamedNode = (sysbvm_astTupleSlotNamedAtNode_t**)node;
    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.tuple = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*slotNamedNode)->tupleExpression);
    gcFrame.slot = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (*slotNamedNode)->boundSlot);
    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*slotNamedNode)->super.analyzedType);
    if(sysbvm_type_isPointerLikeType(sysbvm_astNode_getAnalyzedType((*slotNamedNode)->tupleExpression)))
        sysbvm_functionBytecodeAssembler_refSlotAt(context, (*compiler)->assembler, gcFrame.result, gcFrame.tuple, gcFrame.slot);
    else
        sysbvm_functionBytecodeAssembler_slotAt(context, (*compiler)->assembler, gcFrame.result, gcFrame.tuple, gcFrame.slot);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}